

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O0

CURLdigest Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  char *local_560;
  char *tok_buf;
  char content [1024];
  char value [256];
  digestdata *d;
  _Bool before;
  SessionHandle *data;
  _Bool foundAuthInt;
  _Bool foundAuth;
  char *tmp;
  char *token;
  char *header_local;
  connectdata *pcStack_18;
  _Bool proxy_local;
  connectdata *conn_local;
  
  bVar2 = false;
  bVar3 = false;
  if (proxy) {
    value._248_8_ = &(conn->data->state).proxydigest;
  }
  else {
    value._248_8_ = &(conn->data->state).digest;
  }
  token = header;
  header_local._7_1_ = proxy;
  pcStack_18 = conn;
  iVar4 = Curl_raw_nequal("Digest",header,6);
  if (iVar4 == 0) {
    return CURLDIGEST_NONE;
  }
  token = token + 6;
  lVar1 = *(long *)value._248_8_;
  digest_cleanup_one((digestdata *)value._248_8_);
  while( true ) {
    while( true ) {
      bVar7 = false;
      if (*token != '\0') {
        ppuVar5 = __ctype_b_loc();
        bVar7 = ((*ppuVar5)[(int)(uint)(byte)*token] & 0x2000) != 0;
      }
      if (!bVar7) break;
      token = token + 1;
    }
    iVar4 = get_pair(token,content + 0x3f8,(char *)&tok_buf,&token);
    if (iVar4 != 0) break;
    iVar4 = Curl_raw_equal(content + 0x3f8,"nonce");
    if (iVar4 == 0) {
      iVar4 = Curl_raw_equal(content + 0x3f8,"stale");
      if (iVar4 == 0) {
        iVar4 = Curl_raw_equal(content + 0x3f8,"realm");
        if (iVar4 == 0) {
          iVar4 = Curl_raw_equal(content + 0x3f8,"opaque");
          if (iVar4 == 0) {
            iVar4 = Curl_raw_equal(content + 0x3f8,"qop");
            if (iVar4 == 0) {
              iVar4 = Curl_raw_equal(content + 0x3f8,"algorithm");
              if (iVar4 != 0) {
                pcVar6 = (*Curl_cstrdup)((char *)&tok_buf);
                *(char **)(value._248_8_ + 0x30) = pcVar6;
                if (*(long *)(value._248_8_ + 0x30) == 0) {
                  return CURLDIGEST_NOMEM;
                }
                iVar4 = Curl_raw_equal((char *)&tok_buf,"MD5-sess");
                if (iVar4 == 0) {
                  iVar4 = Curl_raw_equal((char *)&tok_buf,"MD5");
                  if (iVar4 == 0) {
                    return CURLDIGEST_BADALGO;
                  }
                  *(undefined4 *)(value._248_8_ + 0x18) = 0;
                }
                else {
                  *(undefined4 *)(value._248_8_ + 0x18) = 1;
                }
              }
            }
            else {
              pcVar6 = (*Curl_cstrdup)((char *)&tok_buf);
              if (pcVar6 == (char *)0x0) {
                return CURLDIGEST_NOMEM;
              }
              tmp = strtok_r(pcVar6,",",&local_560);
              while (tmp != (char *)0x0) {
                iVar4 = Curl_raw_equal(tmp,"auth");
                if (iVar4 == 0) {
                  iVar4 = Curl_raw_equal(tmp,"auth-int");
                  if (iVar4 != 0) {
                    bVar3 = true;
                  }
                }
                else {
                  bVar2 = true;
                }
                tmp = strtok_r((char *)0x0,",",&local_560);
              }
              (*Curl_cfree)(pcVar6);
              if (bVar2) {
                pcVar6 = (*Curl_cstrdup)("auth");
                *(char **)(value._248_8_ + 0x28) = pcVar6;
                if (*(long *)(value._248_8_ + 0x28) == 0) {
                  return CURLDIGEST_NOMEM;
                }
              }
              else if (bVar3) {
                pcVar6 = (*Curl_cstrdup)("auth-int");
                *(char **)(value._248_8_ + 0x28) = pcVar6;
                if (*(long *)(value._248_8_ + 0x28) == 0) {
                  return CURLDIGEST_NOMEM;
                }
              }
            }
          }
          else {
            pcVar6 = (*Curl_cstrdup)((char *)&tok_buf);
            *(char **)(value._248_8_ + 0x20) = pcVar6;
            if (*(long *)(value._248_8_ + 0x20) == 0) {
              return CURLDIGEST_NOMEM;
            }
          }
        }
        else {
          pcVar6 = (*Curl_cstrdup)((char *)&tok_buf);
          *(char **)(value._248_8_ + 0x10) = pcVar6;
          if (*(long *)(value._248_8_ + 0x10) == 0) {
            return CURLDIGEST_NOMEM;
          }
        }
      }
      else {
        iVar4 = Curl_raw_equal((char *)&tok_buf,"true");
        if (iVar4 != 0) {
          *(undefined1 *)(value._248_8_ + 0x1c) = 1;
          *(undefined4 *)(value._248_8_ + 0x38) = 1;
        }
      }
    }
    else {
      pcVar6 = (*Curl_cstrdup)((char *)&tok_buf);
      *(char **)value._248_8_ = pcVar6;
      if (*(long *)value._248_8_ == 0) {
        return CURLDIGEST_NOMEM;
      }
    }
    while( true ) {
      bVar7 = false;
      if (*token != '\0') {
        ppuVar5 = __ctype_b_loc();
        bVar7 = ((*ppuVar5)[(int)(uint)(byte)*token] & 0x2000) != 0;
      }
      if (!bVar7) break;
      token = token + 1;
    }
    if (*token == ',') {
      token = token + 1;
    }
  }
  if ((lVar1 != 0) && ((*(byte *)(value._248_8_ + 0x1c) & 1) == 0)) {
    return CURLDIGEST_BAD;
  }
  if (*(long *)value._248_8_ == 0) {
    return CURLDIGEST_BAD;
  }
  return CURLDIGEST_FINE;
}

Assistant:

CURLdigest Curl_input_digest(struct connectdata *conn,
                             bool proxy,
                             const char *header) /* rest of the *-authenticate:
                                                    header */
{
  char *token = NULL;
  char *tmp = NULL;
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  struct SessionHandle *data=conn->data;
  bool before = FALSE; /* got a nonce before */
  struct digestdata *d;

  if(proxy) {
    d = &data->state.proxydigest;
  }
  else {
    d = &data->state.digest;
  }

  if(checkprefix("Digest", header)) {
    header += strlen("Digest");

    /* If we already have received a nonce, keep that in mind */
    if(d->nonce)
      before = TRUE;

    /* clear off any former leftovers and init to defaults */
    digest_cleanup_one(d);

    for(;;) {
      char value[MAX_VALUE_LENGTH];
      char content[MAX_CONTENT_LENGTH];

      while(*header && ISSPACE(*header))
        header++;

      /* extract a value=content pair */
      if(!get_pair(header, value, content, &header)) {
        if(Curl_raw_equal(value, "nonce")) {
          d->nonce = strdup(content);
          if(!d->nonce)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "stale")) {
          if(Curl_raw_equal(content, "true")) {
            d->stale = TRUE;
            d->nc = 1; /* we make a new nonce now */
          }
        }
        else if(Curl_raw_equal(value, "realm")) {
          d->realm = strdup(content);
          if(!d->realm)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "opaque")) {
          d->opaque = strdup(content);
          if(!d->opaque)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "qop")) {
          char *tok_buf;
          /* tokenize the list and choose auth if possible, use a temporary
             clone of the buffer since strtok_r() ruins it */
          tmp = strdup(content);
          if(!tmp)
            return CURLDIGEST_NOMEM;
          token = strtok_r(tmp, ",", &tok_buf);
          while(token != NULL) {
            if(Curl_raw_equal(token, "auth")) {
              foundAuth = TRUE;
            }
            else if(Curl_raw_equal(token, "auth-int")) {
              foundAuthInt = TRUE;
            }
            token = strtok_r(NULL, ",", &tok_buf);
          }
          free(tmp);
          /*select only auth o auth-int. Otherwise, ignore*/
          if(foundAuth) {
            d->qop = strdup("auth");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
          else if(foundAuthInt) {
            d->qop = strdup("auth-int");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
        }
        else if(Curl_raw_equal(value, "algorithm")) {
          d->algorithm = strdup(content);
          if(!d->algorithm)
            return CURLDIGEST_NOMEM;
          if(Curl_raw_equal(content, "MD5-sess"))
            d->algo = CURLDIGESTALGO_MD5SESS;
          else if(Curl_raw_equal(content, "MD5"))
            d->algo = CURLDIGESTALGO_MD5;
          else
            return CURLDIGEST_BADALGO;
        }
        else {
          /* unknown specifier, ignore it! */
        }
      }
      else
        break; /* we're done here */

      /* pass all additional spaces here */
      while(*header && ISSPACE(*header))
        header++;
      if(',' == *header)
        /* allow the list to be comma-separated */
        header++;
    }
    /* We had a nonce since before, and we got another one now without
       'stale=true'. This means we provided bad credentials in the previous
       request */
    if(before && !d->stale)
      return CURLDIGEST_BAD;

    /* We got this header without a nonce, that's a bad Digest line! */
    if(!d->nonce)
      return CURLDIGEST_BAD;
  }
  else
    /* else not a digest, get out */
    return CURLDIGEST_NONE;

  return CURLDIGEST_FINE;
}